

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O2

node_t * __thiscall
expression_tree::node<int,_expression_tree::no_caching,_expression_tree::sequential>::operator=
          (node<int,_expression_tree::no_caching,_expression_tree::sequential> *this,int *t)

{
  node_impl<int> *pnVar1;
  node_impl<int> *pnVar2;
  
  pnVar2 = (node_impl<int> *)operator_new(0x10);
  pnVar2->_vptr_node_impl = (_func_int **)&PTR__node_impl_00123150;
  *(int *)&pnVar2[1]._vptr_node_impl = *t;
  pnVar1 = (this->impl)._M_t.
           super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
           .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl;
  (this->impl)._M_t.
  super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl = pnVar2;
  if (pnVar1 != (node_impl<int> *)0x0) {
    (*pnVar1->_vptr_node_impl[1])();
  }
  if (this->parent != (node<int,_expression_tree::no_caching,_expression_tree::sequential> *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const T& t)
	{
		impl.reset(new detail::leaf<T>(t));

		if(parent)
		{
			parent->modified();
		}

		return *this;
	}